

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

char * __thiscall cmCPackGenerator::GetOption(cmCPackGenerator *this,string *op)

{
  cmCPackLog *this_00;
  char *pcVar1;
  ostream *poVar2;
  char *local_1b8 [4];
  ostringstream cmCPackLog_msg;
  
  pcVar1 = cmMakefile::GetDefinition(this->MakefileMap,op);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCPackLog_msg,"Warning, GetOption return NULL for: ");
    poVar2 = std::operator<<(poVar2,(string *)op);
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x4c3,local_1b8[0]);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  }
  return pcVar1;
}

Assistant:

const char* cmCPackGenerator::GetOption(const std::string& op) const
{
  const char* ret = this->MakefileMap->GetDefinition(op);
  if(!ret)
    {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Warning, GetOption return NULL for: "
                  << op
                  << std::endl);
    }
  return ret;
}